

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::CreateSymbol(Lexer *this,int64_t integer)

{
  undefined1 local_50 [8];
  Symbol symbol;
  int64_t integer_local;
  Lexer *this_local;
  
  symbol._48_8_ = integer;
  Symbol::Symbol((Symbol *)local_50,IntegerValue,this->m_lineNumber,this->m_columnMarker);
  symbol.text.field_2._8_4_ = symbol.lineNumber;
  symbol.text.field_2._12_4_ = symbol.columnNumber;
  std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::push_back
            (&this->m_symbolList,(Symbol *)local_50);
  this->m_columnMarker = this->m_columnNumber;
  Symbol::~Symbol((Symbol *)local_50);
  return;
}

Assistant:

inline_t void Lexer::CreateSymbol(int64_t integer)
	{
		Symbol symbol(SymbolType::IntegerValue, m_lineNumber, m_columnMarker);
		symbol.intVal = integer;
		m_symbolList.push_back(symbol);
		m_columnMarker = m_columnNumber;
	}